

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EmptyCore.cpp
# Opt level: O3

string * __thiscall
helics::EmptyCore::query_abi_cxx11_
          (string *__return_storage_ptr__,EmptyCore *this,string_view target,string_view queryStr,
          HelicsSequencingModes param_3)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  int iVar2;
  undefined4 extraout_var;
  pointer pcVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  size_t __n;
  undefined8 uVar6;
  _Alloc_hider _Var7;
  long *plVar8;
  size_type __rlen;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  size_type __dnew;
  size_type __dnew_1;
  string local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  plVar8 = (long *)queryStr._M_str;
  __n = target._M_len;
  if ((__n != 4) || (*(int *)target._M_str != 0x65726f63)) {
    iVar2 = (*(this->super_Core)._vptr_Core[0xc])(this);
    if (((undefined8 *)CONCAT44(extraout_var,iVar2))[1] == __n) {
      if ((__n != 0) &&
         (iVar2 = bcmp(target._M_str,*(void **)CONCAT44(extraout_var,iVar2),__n), iVar2 != 0))
      goto LAB_0037a4ed;
      goto LAB_0037a4b8;
    }
    if (__n == 0) goto LAB_0037a4b8;
LAB_0037a4ed:
    local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_68,"Federate is disconnected","");
    generateJsonErrorResponse(__return_storage_ptr__,DISCONNECTED,&local_68);
    goto LAB_0037a76b;
  }
LAB_0037a4b8:
  switch(queryStr._M_len) {
  case 4:
    if ((int)*plVar8 != 0x656d616e) break;
LAB_0037a699:
    local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
    local_48.field_2._M_allocated_capacity._0_2_ = 0x22;
    local_48._M_string_length = 1;
    pbVar4 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             append(&local_48,"null");
    local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
    paVar1 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(pbVar4->_M_dataplus)._M_p;
    paVar5 = &pbVar4->field_2;
    if (paVar1 == (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)paVar5) {
      local_68.field_2._M_allocated_capacity = paVar5->_M_allocated_capacity;
      local_68.field_2._8_8_ = *(undefined8 *)((long)&pbVar4->field_2 + 8);
    }
    else {
      local_68.field_2._M_allocated_capacity = paVar5->_M_allocated_capacity;
      local_68._M_dataplus._M_p = (pointer)paVar1;
    }
    local_68._M_string_length = pbVar4->_M_string_length;
    (pbVar4->_M_dataplus)._M_p = (pointer)paVar5;
    pbVar4->_M_string_length = 0;
    (pbVar4->field_2)._M_local_buf[0] = '\0';
    pbVar4 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             _M_replace_aux((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &local_68,local_68._M_string_length,0,1,'\"');
    goto LAB_0037a81c;
  case 6:
    if (*(short *)((long)plVar8 + 4) == 0x7469 && (int)*plVar8 == 0x6e697369) {
LAB_0037a792:
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      *(undefined4 *)&__return_storage_ptr__->field_2 = 0x736c6166;
      *(undefined2 *)((long)&__return_storage_ptr__->field_2 + 4) = 0x65;
      __return_storage_ptr__->_M_string_length = 5;
      return __return_storage_ptr__;
    }
    if (*(short *)((long)plVar8 + 4) == 0x7374 && (int)*plVar8 == 0x73697865) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      *(undefined4 *)&__return_storage_ptr__->field_2 = 0x65757274;
      __return_storage_ptr__->_M_string_length = 4;
      (__return_storage_ptr__->field_2)._M_local_buf[4] = '\0';
      return __return_storage_ptr__;
    }
    break;
  case 7:
    if (*(int *)((long)plVar8 + 3) == 0x73656972 && (int)*plVar8 == 0x72657571) {
LAB_0037a5d9:
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      local_68._M_dataplus._M_p = (pointer)0x168;
      pcVar3 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
               ::_M_create((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           __return_storage_ptr__,(size_type *)&local_68,0);
      _Var7._M_p = local_68._M_dataplus._M_p;
      (__return_storage_ptr__->_M_dataplus)._M_p = pcVar3;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = (size_type)local_68._M_dataplus._M_p
      ;
      memcpy(pcVar3,
             "[\"isinit\",\"isconnected\",\"exists\",\"name\",\"identifier\",\"address\",\"queries\",\"address\",\"federates\",\"inputs\",\"endpoints\",\"filtered_endpoints\",\"publications\",\"filters\",\"tags\",\"version\",\"version_all\",\"federate_map\",\"dependency_graph\",\"data_flow_graph\",\"dependencies\",\"dependson\",\"dependents\",\"current_time\",\"global_time\",\"global_state\",\"global_flush\",\"current_state\"]"
             ,0x168);
      __return_storage_ptr__->_M_string_length = (size_type)_Var7._M_p;
      pcVar3[(long)_Var7._M_p] = '\0';
      return __return_storage_ptr__;
    }
    if (*(int *)((long)plVar8 + 3) != 0x6e6f6973 || (int)*plVar8 != 0x73726576) break;
    local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
    local_48.field_2._M_allocated_capacity._0_2_ = 0x22;
    local_48._M_string_length = 1;
    pbVar4 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             append(&local_48,"3.6.1 (2025-02-24)");
    local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
    paVar1 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(pbVar4->_M_dataplus)._M_p;
    paVar5 = &pbVar4->field_2;
    if (paVar1 == (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)paVar5) {
      local_68.field_2._M_allocated_capacity = paVar5->_M_allocated_capacity;
      local_68.field_2._8_8_ = *(undefined8 *)((long)&pbVar4->field_2 + 8);
    }
    else {
      local_68.field_2._M_allocated_capacity = paVar5->_M_allocated_capacity;
      local_68._M_dataplus._M_p = (pointer)paVar1;
    }
    local_68._M_string_length = pbVar4->_M_string_length;
    (pbVar4->_M_dataplus)._M_p = (pointer)paVar5;
    pbVar4->_M_string_length = 0;
    (pbVar4->field_2)._M_local_buf[0] = '\0';
    pbVar4 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             _M_replace_aux((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &local_68,local_68._M_string_length,0,1,'\"');
LAB_0037a81c:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar3 = (pbVar4->_M_dataplus)._M_p;
    paVar5 = &pbVar4->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar3 == paVar5) {
      uVar6 = *(undefined8 *)((long)&pbVar4->field_2 + 8);
      (__return_storage_ptr__->field_2)._M_allocated_capacity = paVar5->_M_allocated_capacity;
      *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uVar6;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = pcVar3;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = paVar5->_M_allocated_capacity;
    }
    __return_storage_ptr__->_M_string_length = pbVar4->_M_string_length;
    (pbVar4->_M_dataplus)._M_p = (pointer)paVar5;
    pbVar4->_M_string_length = 0;
    (pbVar4->field_2)._M_local_buf[0] = '\0';
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p,(ulong)(local_68.field_2._M_allocated_capacity + 1))
      ;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p == &local_48.field_2) {
      return __return_storage_ptr__;
    }
    uVar6 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT62(local_48.field_2._M_allocated_capacity._2_6_,
                        local_48.field_2._M_allocated_capacity._0_2_);
    _Var7._M_p = local_48._M_dataplus._M_p;
    goto LAB_0037a779;
  case 10:
    if ((short)plVar8[1] == 0x7265 && *plVar8 == 0x696669746e656469) goto LAB_0037a699;
    break;
  case 0xb:
    if (*(long *)((long)plVar8 + 3) == 0x64657463656e6e6f && *plVar8 == 0x63656e6e6f637369)
    goto LAB_0037a792;
    break;
  case 0x11:
    auVar9[0] = -((char)*plVar8 == 'a');
    auVar9[1] = -(*(char *)((long)plVar8 + 1) == 'v');
    auVar9[2] = -(*(char *)((long)plVar8 + 2) == 'a');
    auVar9[3] = -(*(char *)((long)plVar8 + 3) == 'i');
    auVar9[4] = -(*(char *)((long)plVar8 + 4) == 'l');
    auVar9[5] = -(*(char *)((long)plVar8 + 5) == 'a');
    auVar9[6] = -(*(char *)((long)plVar8 + 6) == 'b');
    auVar9[7] = -(*(char *)((long)plVar8 + 7) == 'l');
    auVar9[8] = -((char)plVar8[1] == 'e');
    auVar9[9] = -(*(char *)((long)plVar8 + 9) == '_');
    auVar9[10] = -(*(char *)((long)plVar8 + 10) == 'q');
    auVar9[0xb] = -(*(char *)((long)plVar8 + 0xb) == 'u');
    auVar9[0xc] = -(*(char *)((long)plVar8 + 0xc) == 'e');
    auVar9[0xd] = -(*(char *)((long)plVar8 + 0xd) == 'r');
    auVar9[0xe] = -(*(char *)((long)plVar8 + 0xe) == 'i');
    auVar9[0xf] = -(*(char *)((long)plVar8 + 0xf) == 'e');
    auVar10[0] = -((char)plVar8[2] == 's');
    auVar10[1] = 0xff;
    auVar10[2] = 0xff;
    auVar10[3] = 0xff;
    auVar10[4] = 0xff;
    auVar10[5] = 0xff;
    auVar10[6] = 0xff;
    auVar10[7] = 0xff;
    auVar10[8] = 0xff;
    auVar10[9] = 0xff;
    auVar10[10] = 0xff;
    auVar10[0xb] = 0xff;
    auVar10[0xc] = 0xff;
    auVar10[0xd] = 0xff;
    auVar10[0xe] = 0xff;
    auVar10[0xf] = 0xff;
    auVar10 = auVar10 & auVar9;
    if ((ushort)((ushort)(SUB161(auVar10 >> 7,0) & 1) | (ushort)(SUB161(auVar10 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar10 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar10 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar10 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar10 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar10 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar10 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar10 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar10 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar10 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar10 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar10 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar10 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar10 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar10[0xf] >> 7) << 0xf) == 0xffff) goto LAB_0037a5d9;
  }
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  local_48._M_dataplus._M_p = (pointer)0x14;
  local_68._M_dataplus._M_p =
       CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
       _M_create((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_68,
                 (size_type *)&local_48,0);
  local_68.field_2._M_allocated_capacity = (size_type)local_48._M_dataplus._M_p;
  *(undefined8 *)local_68._M_dataplus._M_p = 0x2073692065726f43;
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_68._M_dataplus._M_p + 8) = 'd';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_68._M_dataplus._M_p + 9) = 'i';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_68._M_dataplus._M_p + 10) = 's';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_68._M_dataplus._M_p + 0xb) = 'c';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_68._M_dataplus._M_p + 0xc) = 'o';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_68._M_dataplus._M_p + 0xd) = 'n';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_68._M_dataplus._M_p + 0xe) = 'n';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_68._M_dataplus._M_p + 0xf) = 'e';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_68._M_dataplus._M_p + 0x10) = 'c';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_68._M_dataplus._M_p + 0x11) = 't';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_68._M_dataplus._M_p + 0x12) = 'e';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_68._M_dataplus._M_p + 0x13) = 'd';
  local_68._M_string_length = (size_type)local_48._M_dataplus._M_p;
  local_68._M_dataplus._M_p[local_48._M_dataplus._M_p] = '\0';
  generateJsonErrorResponse(__return_storage_ptr__,DISCONNECTED,&local_68);
LAB_0037a76b:
  uVar6 = local_68.field_2._M_allocated_capacity;
  _Var7._M_p = local_68._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
LAB_0037a779:
    operator_delete(_Var7._M_p,(ulong)(uVar6 + 1));
  }
  return __return_storage_ptr__;
}

Assistant:

std::string EmptyCore::query(std::string_view target,
                             std::string_view queryStr,
                             HelicsSequencingModes /*mode*/)
{
    if (target == "core" || target == getIdentifier() || target.empty()) {
        return quickCoreQueries(queryStr);
    }
    return generateJsonErrorResponse(JsonErrorCodes::DISCONNECTED, "Federate is disconnected");
}